

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

common_chat_msg * common_chat_parse_hermes_2_pro(string *input,bool extract_reasoning)

{
  function<common_chat_msg_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RSI;
  common_chat_msg *in_RDI;
  function<common_chat_msg_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_000001f8;
  undefined1 in_stack_00000207;
  string *in_stack_00000208;
  
  std::function<common_chat_msg(std::__cxx11::string_const&)>::
  function<common_chat_parse_hermes_2_pro(std::__cxx11::string_const&,bool)::__0,void>
            (in_RSI,(anon_class_1_0_00000001 *)in_RDI);
  handle_think_tag_prelude(in_stack_00000208,(bool)in_stack_00000207,in_stack_000001f8);
  std::
  function<common_chat_msg_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<common_chat_msg_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x2a6360);
  return in_RDI;
}

Assistant:

static common_chat_msg common_chat_parse_hermes_2_pro(const std::string& input, bool extract_reasoning) {
    return handle_think_tag_prelude(input, extract_reasoning, [](const std::string & input) {
        static const std::regex open_regex(
            "(?:"
            "(```(?:xml|json)?\\n\\s*)?"         // match 1 (block_start)
            "(<tool_call>"                   // match 2 (open_tag)
            "|<function_call>"
            "|<tool>"
            "|<tools>"
            "|<response>"
            "|<json>"
            "|<xml>"
            "|<JSON>"
            ")?"
            "(\\s*\\{\\s*\"name\"\\s*:[\\s\\S]*)"    // match 3 (named tool call + rest)
            ")"
            "|"
            "(?:<function=([^>]+)>"            // match 4 (function name)
            "|<function name=\"([^\"]+)\">)" // match 5 (function name again)
            "([\\s\\S]*)"                   // match 6 (function arguments + rest)})"
        );

        try {
            common_chat_msg msg;
            msg.role = "assistant";

            std::string::const_iterator it = input.begin();
            const std::string::const_iterator end = input.end();
            std::smatch match;

            while (it != end) {
                if (std::regex_search(it, end, match, open_regex)) {
                    // Add content before the match
                    msg.content += std::string(it, match[0].first);

                    auto block_start = match[1].str();
                    std::string block_end = block_start.empty() ? "" : "```";

                    auto open_tag = match[2].str();
                    std::string close_tag;

                    if (match[3].matched) {
                        close_tag = open_tag.empty() ? "" : "</" + open_tag.substr(1);
                        auto json_it = match[3].first;
                        json tool_call;
                        if (parse_json(json_it, end, tool_call) && tool_call.contains("name") && tool_call.contains("arguments")) {

                            msg.tool_calls.emplace_back(process_tool_call(tool_call));
                            it = json_it;  // Move iterator past parsed JSON

                            // Handle close tags
                            consume_spaces(it, end);
                            if (!close_tag.empty() && !parse_literal(it, end, close_tag)) {
                                throw std::runtime_error("Failed to parse closing tag");
                            }
                            consume_spaces(it, end);
                            if (!block_end.empty() && !parse_literal(it, end, block_end)) {
                                throw std::runtime_error("Failed to parse block end");
                            }
                            consume_spaces(it, end);
                        } else {
                            // Not a valid tool call, treat as content
                            msg.content += std::string(match[0].first, match[0].second);
                            it = match[0].second;
                        }
                    } else {
                        auto function_name = match[4].str();
                        if (function_name.empty()) {
                            function_name = match[5].str();
                        }
                        GGML_ASSERT(!function_name.empty());

                        close_tag = "</function>";
                        // Start parsing from after the opening tags
                        auto json_it = match[6].first;
                        json arguments;
                        if (parse_json(json_it, end, arguments)) {
                            msg.tool_calls.emplace_back(process_tool_call({
                                {"name", function_name},
                                {"arguments", arguments},
                            }));
                            it = json_it;  // Move iterator past parsed JSON

                            // Handle close tags
                            consume_spaces(it, end);
                            if (!close_tag.empty() && !parse_literal(it, end, close_tag)) {
                                throw std::runtime_error("Failed to parse closing tag");
                            }
                            consume_spaces(it, end);
                            if (!block_end.empty() && !parse_literal(it, end, block_end)) {
                                throw std::runtime_error("Failed to parse block end");
                            }
                            consume_spaces(it, end);
                        } else {
                            // Not a valid tool call, treat as content
                            msg.content += std::string(match[0].first, match[0].second);
                            it = match[0].second;
                        }
                    }
                } else {
                    // Add remaining content
                    msg.content += std::string(it, end);
                    break;
                }
            }
            return msg;
        } catch (const std::exception & e) {
            LOG_ERR("Failed to parse hermes 2 pro input: %s\n", e.what());
            common_chat_msg msg;
            msg.role = "assistant";
            msg.content = input;
            return msg;
        }
    });
}